

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<unsigned_int,long_long>(void)

{
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_00;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_01;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_02;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_03;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_04;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_05;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_06;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_07;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_08;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_09;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_10;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_11;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_12;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> bits;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> bits_00
  ;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> bits_01
  ;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> bits_02
  ;
  longlong u2;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st2;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st;
  bool b;
  uint t;
  longlong u;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffd68;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffd70;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffd74;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  undefined4 uVar1;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffd80;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  SVar2;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined4 local_24;
  undefined8 local_20;
  undefined4 local_14;
  byte local_d;
  uint local_c;
  longlong local_8;
  
  local_8 = 0;
  local_c = 0;
  local_d = 0;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<long_long>((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
                     &in_stack_fffffffffffffd68->m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
           *)&local_20,&local_8);
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<long_long>((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)in_stack_fffffffffffffd80.m_int,
                     (SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  local_d = (local_d ^ 0xff) & 1;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd80.m_int,
            (uint *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd80.m_int,
            (longlong *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
            in_stack_fffffffffffffd68);
  local_14 = local_24;
  SafeInt::operator_cast_to_long_long
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
            CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator*((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
            (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )(uint)in_stack_fffffffffffffd80.m_int);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  operator*((longlong)in_stack_fffffffffffffd68,in_stack_fffffffffffffd70);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
             (longlong)in_stack_fffffffffffffd68);
  rhs.m_int._4_4_ = in_stack_fffffffffffffd74.m_int;
  rhs.m_int._0_4_ = in_stack_fffffffffffffd70.m_int;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd68,rhs);
  local_8 = 1;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd80.m_int,
            (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd80.m_int,
            (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
            CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd80.m_int,
            (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator%((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
            (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )(uint)in_stack_fffffffffffffd80.m_int);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
             (longlong)in_stack_fffffffffffffd68);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             in_stack_fffffffffffffd80);
  local_8 = 1;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd80.m_int,
            (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd80.m_int,
            (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
            CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator/((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
            (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )(uint)in_stack_fffffffffffffd80.m_int);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  operator/(CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
            (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )(uint)in_stack_fffffffffffffd90.m_int);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
             (longlong)in_stack_fffffffffffffd68);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             in_stack_fffffffffffffd80);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
            CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator+((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
            (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )(uint)in_stack_fffffffffffffd80.m_int);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  operator+((longlong)in_stack_fffffffffffffd68,in_stack_fffffffffffffd70);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
             (longlong)in_stack_fffffffffffffd68);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             in_stack_fffffffffffffd80);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd80.m_int,
            (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  local_8 = 0;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd80.m_int,
            (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
            CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator-((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
            (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )(uint)in_stack_fffffffffffffd80.m_int);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  operator-((longlong)in_stack_fffffffffffffd68,in_stack_fffffffffffffd70);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
             (longlong)in_stack_fffffffffffffd68);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd80.m_int,
            (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd80.m_int,
            (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             in_stack_fffffffffffffd80);
  local_8 = 1;
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd80.m_int,
            (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  bits_01.m_int._4_4_ = in_stack_fffffffffffffd9c;
  bits_01.m_int._0_4_ = in_stack_fffffffffffffd98;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd90.m_int,bits_01);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  bits.m_int._4_4_ = in_stack_fffffffffffffd8c;
  bits.m_int._0_4_ = in_stack_fffffffffffffd88;
  operator<<((uint)((ulong)in_stack_fffffffffffffd80.m_int >> 0x20),bits);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
              (longlong)in_stack_fffffffffffffd68);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
              in_stack_fffffffffffffd90);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  bits_02.m_int._4_4_ = in_stack_fffffffffffffd9c;
  bits_02.m_int._0_4_ = in_stack_fffffffffffffd98;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd90.m_int,bits_02);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  bits_00.m_int._4_4_ = in_stack_fffffffffffffd8c;
  bits_00.m_int._0_4_ = in_stack_fffffffffffffd88;
  operator>>((uint)((ulong)in_stack_fffffffffffffd80.m_int >> 0x20),bits_00);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
              (longlong)in_stack_fffffffffffffd68);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
              in_stack_fffffffffffffd90);
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator&((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
            (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )(uint)in_stack_fffffffffffffd80.m_int);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator&((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
            CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  rhs_00.m_int._4_4_ = in_stack_fffffffffffffd7c;
  rhs_00.m_int._0_4_ = in_stack_fffffffffffffd78;
  operator&(in_stack_fffffffffffffd74.m_int,rhs_00);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator&=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(uint)((ulong)in_stack_fffffffffffffd80.m_int >> 0x20));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator&=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
             (longlong)in_stack_fffffffffffffd68);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator&=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             in_stack_fffffffffffffd80);
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator|((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
            (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )(uint)in_stack_fffffffffffffd80.m_int);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator|((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
            CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  rhs_01.m_int._4_4_ = in_stack_fffffffffffffd7c;
  rhs_01.m_int._0_4_ = in_stack_fffffffffffffd78;
  operator|(in_stack_fffffffffffffd74.m_int,rhs_01);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator|=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(uint)((ulong)in_stack_fffffffffffffd80.m_int >> 0x20));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator|=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
             (longlong)in_stack_fffffffffffffd68);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator|=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             in_stack_fffffffffffffd80);
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator^((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
            (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )(uint)in_stack_fffffffffffffd80.m_int);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator^((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
            CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  rhs_02.m_int._4_4_ = in_stack_fffffffffffffd7c;
  rhs_02.m_int._0_4_ = in_stack_fffffffffffffd78;
  operator^(in_stack_fffffffffffffd74.m_int,rhs_02);
  local_c = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator^=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(uint)((ulong)in_stack_fffffffffffffd80.m_int >> 0x20));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator^=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
             (longlong)in_stack_fffffffffffffd68);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator^=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             in_stack_fffffffffffffd80);
  SVar2.m_int = (uint)((ulong)in_stack_fffffffffffffd80.m_int >> 0x20);
  rhs_03.m_int._4_4_ = in_stack_fffffffffffffd7c;
  rhs_03.m_int._0_4_ = in_stack_fffffffffffffd78;
  local_d = operator<(SVar2,rhs_03);
  local_d = operator<(SVar2,CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  local_d = operator<((longlong)in_stack_fffffffffffffd68,in_stack_fffffffffffffd74);
  rhs_04.m_int._4_4_ = in_stack_fffffffffffffd7c;
  rhs_04.m_int._0_4_ = in_stack_fffffffffffffd78;
  local_d = operator<(SVar2,rhs_04);
  rhs_05.m_int._4_4_ = in_stack_fffffffffffffd7c;
  rhs_05.m_int._0_4_ = in_stack_fffffffffffffd78;
  local_d = operator<=(SVar2,rhs_05);
  local_d = operator<=(in_stack_fffffffffffffd74,(longlong)in_stack_fffffffffffffd68);
  local_d = operator<=(CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),SVar2);
  rhs_06.m_int._4_4_ = in_stack_fffffffffffffd7c;
  rhs_06.m_int._0_4_ = in_stack_fffffffffffffd78;
  local_d = operator<=(SVar2,rhs_06);
  rhs_07.m_int._4_4_ = in_stack_fffffffffffffd7c;
  rhs_07.m_int._0_4_ = in_stack_fffffffffffffd78;
  local_d = operator>(SVar2,rhs_07);
  local_d = operator>(in_stack_fffffffffffffd74,(longlong)in_stack_fffffffffffffd68);
  local_d = operator>(CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),SVar2);
  rhs_08.m_int._4_4_ = in_stack_fffffffffffffd7c;
  rhs_08.m_int._0_4_ = in_stack_fffffffffffffd78;
  local_d = operator>(SVar2,rhs_08);
  rhs_09.m_int._4_4_ = in_stack_fffffffffffffd7c;
  rhs_09.m_int._0_4_ = in_stack_fffffffffffffd78;
  local_d = operator>=(SVar2,rhs_09);
  local_d = operator>=(SVar2,CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  local_d = operator>=((longlong)in_stack_fffffffffffffd68,in_stack_fffffffffffffd74);
  rhs_10.m_int._4_4_ = in_stack_fffffffffffffd7c;
  rhs_10.m_int._0_4_ = in_stack_fffffffffffffd78;
  local_d = operator>=(SVar2,rhs_10);
  rhs_11.m_int._4_4_ = in_stack_fffffffffffffd7c;
  rhs_11.m_int._0_4_ = in_stack_fffffffffffffd78;
  SVar2.m_int = local_20._4_4_;
  local_d = operator==(local_20._4_4_,rhs_11);
  uVar1 = local_14;
  local_d = operator==(in_stack_fffffffffffffd74,(longlong)in_stack_fffffffffffffd68);
  local_d = operator==((longlong)in_stack_fffffffffffffd68,in_stack_fffffffffffffd74);
  rhs_12.m_int._4_4_ = uVar1;
  rhs_12.m_int._0_4_ = local_14;
  operator==(SVar2,rhs_12);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}